

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

Var __thiscall Js::JavascriptStackWalker::GetThisFromFrame(JavascriptStackWalker *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *this_00;
  FunctionInfo *this_01;
  JavascriptGenerator *this_02;
  Arguments *this_03;
  void **ppvVar4;
  JavascriptGenerator *gen;
  JavascriptStackWalker *this_local;
  
  if ((*(ushort *)&this->field_0x50 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x45b,"(!inlinedFramesBeingWalked)","!inlinedFramesBeingWalked");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsJavascriptFrame(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x45c,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = GetCurrentFunction(this,true);
  this_01 = JavascriptFunction::GetFunctionInfo(this_00);
  bVar2 = FunctionInfo::IsCoroutine(this_01);
  if (bVar2) {
    ppvVar4 = GetCurrentArgv(this);
    this_02 = VarTo<Js::JavascriptGenerator>(ppvVar4[2]);
    this_03 = JavascriptGenerator::GetArguments(this_02);
    this_local = (JavascriptStackWalker *)Arguments::operator[](this_03,0);
  }
  else {
    ppvVar4 = GetCurrentArgv(this);
    this_local = (JavascriptStackWalker *)ppvVar4[2];
  }
  return this_local;
}

Assistant:

Var JavascriptStackWalker::GetThisFromFrame() const
    {
        Assert(!inlinedFramesBeingWalked);
        Assert(this->IsJavascriptFrame());

        if (this->GetCurrentFunction()->GetFunctionInfo()->IsCoroutine())
        {
            JavascriptGenerator* gen = VarTo<JavascriptGenerator>(this->GetCurrentArgv()[JavascriptFunctionArgIndex_This]);
            return gen->GetArguments()[0];
        }

        return this->GetCurrentArgv()[JavascriptFunctionArgIndex_This];
    }